

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LoopPeeling::DuplicateAndConnectLoop
          (LoopPeeling *this,LoopCloningResult *clone_results)

{
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *this_00;
  Function *pFVar1;
  uint32_t *puVar2;
  uint __line;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  CFG *this_01;
  DefUseManager *pDVar6;
  BasicBlock *pBVar7;
  Loop *pLVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  char *__assertion;
  uint32_t *puVar10;
  iterator iVar11;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  DefUseManager *local_58;
  LoopCloningResult *local_50;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ordered_loop_blocks;
  
  this_01 = IRContext::cfg(this->context_);
  pDVar6 = IRContext::get_def_use_mgr(this->context_);
  bVar3 = CanPeelLoop(this);
  if (bVar3) {
    ordered_loop_blocks.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ordered_loop_blocks.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ordered_loop_blocks.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar7 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
    Loop::ComputeLoopStructuredOrder(this->loop_,&ordered_loop_blocks,false,false);
    pLVar8 = LoopUtils::CloneLoop(&this->loop_utils_,clone_results,&ordered_loop_blocks);
    this->cloned_loop_ = pLVar8;
    pFVar1 = (this->loop_utils_).function_;
    uVar4 = BasicBlock::id(pBVar7);
    iVar11 = opt::Function::FindBlock(pFVar1,uVar4);
    pFVar1 = (this->loop_utils_).function_;
    this_00 = &pFVar1->blocks_;
    if ((iVar11.container_ != this_00) ||
       (iVar11.iterator_._M_current._M_current !=
        (pFVar1->blocks_).
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_58 = pDVar6;
      local_50 = clone_results;
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
      ::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>,void>
                ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                  *)this_00,iVar11.iterator_._M_current._M_current + 1,
                 (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>_>
                  )(clone_results->cloned_bb_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>_>
                  )(clone_results->cloned_bb_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      local_78._M_unused._M_object = this->cloned_loop_->loop_header_;
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:74:7)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:74:7)>
                 ::_M_manager;
      BasicBlock::ForEachSuccessorLabel(pBVar7,(function<void_(unsigned_int_*)> *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      uVar4 = BasicBlock::id(pBVar7);
      uVar5 = BasicBlock::id(this->loop_->loop_header_);
      CFG::RemoveEdge(this_01,uVar4,uVar5);
      Loop::SetPreHeaderBlock(this->cloned_loop_,pBVar7);
      uVar5 = 0;
      Loop::SetPreHeaderBlock(this->loop_,(BasicBlock *)0x0);
      uVar4 = BasicBlock::id(this->loop_->loop_merge_);
      pvVar9 = CFG::preds(this_01,uVar4);
      puVar10 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (puVar10 == puVar2) {
          uVar4 = BasicBlock::id(this->loop_->loop_merge_);
          CFG::RemoveNonExistingEdges(this_01,uVar4);
          uVar4 = BasicBlock::id(this->loop_->loop_header_);
          CFG::AddEdge(this_01,uVar5,uVar4);
          pBVar7 = this->loop_->loop_header_;
          local_78._8_8_ = 0;
          local_78._M_unused._M_object = ::operator_new(0x20);
          *(uint32_t *)local_78._M_unused._0_8_ = uVar5;
          *(DefUseManager **)((long)local_78._M_unused._0_8_ + 8) = local_58;
          *(LoopCloningResult **)((long)local_78._M_unused._0_8_ + 0x10) = local_50;
          *(LoopPeeling **)((long)local_78._M_unused._0_8_ + 0x18) = this;
          local_60 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:132:43)>
                     ::_M_invoke;
          local_68 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:132:43)>
                     ::_M_manager;
          BasicBlock::ForEachPhiInst
                    (pBVar7,(function<void_(spvtools::opt::Instruction_*)> *)&local_78,false);
          if (local_68 != (code *)0x0) {
            (*local_68)(&local_78,&local_78,__destroy_functor);
          }
          pLVar8 = this->cloned_loop_;
          pBVar7 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
          Loop::SetMergeBlock(pLVar8,pBVar7);
          std::
          _Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
          ~_Vector_base(&ordered_loop_blocks.
                         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       );
          return;
        }
        uVar4 = *puVar10;
        bVar3 = Loop::IsInsideLoop(this->loop_,uVar4);
        if (!bVar3) {
          pBVar7 = CFG::block(this_01,uVar4);
          if (uVar5 != 0) {
            __assertion = "cloned_loop_exit == 0 && \"The loop has multiple exits.\"";
            __line = 0x5a;
            goto LAB_00514350;
          }
          uVar5 = BasicBlock::id(pBVar7);
          local_78._8_8_ = 0;
          local_60 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:92:31)>
                     ::_M_invoke;
          local_68 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:92:31)>
                     ::_M_manager;
          local_78._M_unused._M_object = this;
          BasicBlock::ForEachSuccessorLabel(pBVar7,(function<void_(unsigned_int_*)> *)&local_78);
          if (local_68 != (code *)0x0) {
            (*local_68)(&local_78,&local_78,__destroy_functor);
          }
        }
        puVar10 = puVar10 + 1;
      } while( true );
    }
    __assertion = 
    "it != loop_utils_.GetFunction()->end() && \"Pre-header not found in the function.\"";
    __line = 0x43;
  }
  else {
    __assertion = "CanPeelLoop() && \"Cannot peel loop!\"";
    __line = 0x35;
  }
LAB_00514350:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,__line,
                "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
               );
}

Assistant:

void LoopPeeling::DuplicateAndConnectLoop(
    LoopUtils::LoopCloningResult* clone_results) {
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  assert(CanPeelLoop() && "Cannot peel loop!");

  std::vector<BasicBlock*> ordered_loop_blocks;
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* pre_header = loop_->GetOrCreatePreHeaderBlock();

  loop_->ComputeLoopStructuredOrder(&ordered_loop_blocks);

  cloned_loop_ = loop_utils_.CloneLoop(clone_results, ordered_loop_blocks);

  // Add the basic block to the function.
  Function::iterator it =
      loop_utils_.GetFunction()->FindBlock(pre_header->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Pre-header not found in the function.");
  loop_utils_.GetFunction()->AddBasicBlocks(
      clone_results->cloned_bb_.begin(), clone_results->cloned_bb_.end(), ++it);

  // Make the |loop_|'s preheader the |cloned_loop_| one.
  BasicBlock* cloned_header = cloned_loop_->GetHeaderBlock();
  pre_header->ForEachSuccessorLabel(
      [cloned_header](uint32_t* succ) { *succ = cloned_header->id(); });

  // Update cfg.
  cfg.RemoveEdge(pre_header->id(), loop_->GetHeaderBlock()->id());
  cloned_loop_->SetPreHeaderBlock(pre_header);
  loop_->SetPreHeaderBlock(nullptr);

  // When cloning the loop, we didn't cloned the merge block, so currently
  // |cloned_loop_| shares the same block as |loop_|.
  // We mutate all branches from |cloned_loop_| block to |loop_|'s merge into a
  // branch to |loop_|'s header (so header will also be the merge of
  // |cloned_loop_|).
  uint32_t cloned_loop_exit = 0;
  for (uint32_t pred_id : cfg.preds(loop_->GetMergeBlock()->id())) {
    if (loop_->IsInsideLoop(pred_id)) continue;
    BasicBlock* bb = cfg.block(pred_id);
    assert(cloned_loop_exit == 0 && "The loop has multiple exits.");
    cloned_loop_exit = bb->id();
    bb->ForEachSuccessorLabel([this](uint32_t* succ) {
      if (*succ == loop_->GetMergeBlock()->id())
        *succ = loop_->GetHeaderBlock()->id();
    });
  }

  // Update cfg.
  cfg.RemoveNonExistingEdges(loop_->GetMergeBlock()->id());
  cfg.AddEdge(cloned_loop_exit, loop_->GetHeaderBlock()->id());

  // Patch the phi of the original loop header:
  //  - Set the loop entry branch to come from the cloned loop exit block;
  //  - Set the initial value of the phi using the corresponding cloned loop
  //    exit values.
  //
  // We patch the iterating value initializers of the original loop using the
  // corresponding cloned loop exit values. Connects the cloned loop iterating
  // values to the original loop. This make sure that the initial value of the
  // second loop starts with the last value of the first loop.
  //
  // For example, loops like:
  //
  // int z = 0;
  // for (int i = 0; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  //
  // Will become:
  //
  // int z = 0;
  // int i = 0;
  // for (; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  // for (; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  loop_->GetHeaderBlock()->ForEachPhiInst([cloned_loop_exit, def_use_mgr,
                                           clone_results,
                                           this](Instruction* phi) {
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      if (!loop_->IsInsideLoop(phi->GetSingleWordInOperand(i + 1))) {
        phi->SetInOperand(i,
                          {clone_results->value_map_.at(
                              exit_value_.at(phi->result_id())->result_id())});
        phi->SetInOperand(i + 1, {cloned_loop_exit});
        def_use_mgr->AnalyzeInstUse(phi);
        return;
      }
    }
  });

  // Force the creation of a new preheader for the original loop and set it as
  // the merge block for the cloned loop.
  // TODO(1841): Handle failure to create pre-header.
  cloned_loop_->SetMergeBlock(loop_->GetOrCreatePreHeaderBlock());
}